

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_perlin.h
# Opt level: O3

float stb_perlin_noise3_wrap_nonpow2
                (float x,float y,float z,int x_wrap,int y_wrap,int z_wrap,uchar seed)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  uint uVar2;
  long lVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  
  iVar19 = -(uint)(y < (float)(int)y);
  iVar20 = -(uint)(x < (float)(int)x);
  auVar1._4_4_ = iVar19;
  auVar1._0_4_ = iVar19;
  auVar1._8_4_ = iVar20;
  auVar1._12_4_ = iVar20;
  uVar2 = movmskpd(in_EAX,auVar1);
  iVar19 = (int)x - (uVar2 >> 1 & 0x7f);
  iVar11 = (int)y - (uVar2 & 1);
  iVar20 = (int)z - (uint)(z < (float)(int)z);
  if (x_wrap == 0) {
    x_wrap = 0x100;
  }
  if (y_wrap == 0) {
    y_wrap = 0x100;
  }
  if (z_wrap == 0) {
    z_wrap = 0x100;
  }
  iVar6 = iVar19 % x_wrap;
  iVar5 = iVar11 % y_wrap;
  iVar16 = iVar20 % z_wrap;
  lVar15 = (long)(iVar6 >> 0x1f & x_wrap) + (long)iVar6;
  uVar2 = iVar5 >> 0x1f & y_wrap;
  uVar17 = iVar16 >> 0x1f & z_wrap;
  uVar4 = CONCAT71(in_register_00000009,seed) & 0xffffffff;
  lVar12 = (long)(int)(uVar2 + iVar5);
  lVar7 = (long)((int)(uVar2 + iVar5 + 1) % y_wrap);
  lVar10 = (long)(int)(uVar17 + iVar16);
  lVar13 = (long)((int)(uVar17 + iVar16 + 1) % z_wrap);
  lVar18 = (ulong)"\a\t\x05"
                  [lVar10 + (ulong)stb__perlin_randtab
                                   [lVar12 + (ulong)stb__perlin_randtab
                                                    [stb__perlin_randtab[lVar15] + uVar4]]] * 0x10;
  lVar3 = (ulong)"\a\t\x05"
                 [lVar10 + (ulong)stb__perlin_randtab
                                  [lVar12 + (ulong)stb__perlin_randtab
                                                   [stb__perlin_randtab[((int)lVar15 + 1) % x_wrap]
                                                    + uVar4]]] * 0x10;
  lVar14 = (ulong)"\a\t\x05"
                  [(ulong)stb__perlin_randtab
                          [lVar12 + (ulong)stb__perlin_randtab[stb__perlin_randtab[lVar15] + uVar4]]
                   + lVar13] * 0x10;
  fVar21 = x - (float)iVar19;
  fVar22 = y - (float)iVar11;
  fVar24 = z - (float)iVar20;
  fVar25 = ((fVar22 * 6.0 + -15.0) * fVar22 + 10.0) * fVar22 * fVar22 * fVar22;
  fVar26 = fVar24 + -1.0;
  fVar31 = fVar22 + -1.0;
  fVar29 = fVar21 + -1.0;
  lVar9 = (ulong)"\a\t\x05"
                 [(ulong)stb__perlin_randtab
                         [lVar12 + (ulong)stb__perlin_randtab
                                          [stb__perlin_randtab[((int)lVar15 + 1) % x_wrap] + uVar4]]
                  + lVar13] * 0x10;
  fVar30 = ((fVar24 * 6.0 + -15.0) * fVar24 + 10.0) * fVar24 * fVar24 * fVar24;
  lVar8 = (ulong)"\a\t\x05"
                 [lVar10 + (ulong)stb__perlin_randtab
                                  [(ulong)stb__perlin_randtab[stb__perlin_randtab[lVar15] + uVar4] +
                                   lVar7]] * 0x10;
  fVar27 = *(float *)(stb__perlin_grad_basis + lVar3 + 8) * fVar24 +
           *(float *)(stb__perlin_grad_basis + lVar3) * fVar29 +
           *(float *)(stb__perlin_grad_basis + lVar3 + 4) * fVar22;
  fVar28 = *(float *)(stb__perlin_grad_basis + lVar18 + 8) * fVar24 +
           *(float *)(stb__perlin_grad_basis + lVar18) * fVar21 +
           *(float *)(stb__perlin_grad_basis + lVar18 + 4) * fVar22;
  lVar12 = (ulong)"\a\t\x05"
                  [lVar10 + (ulong)stb__perlin_randtab
                                   [lVar7 + (ulong)stb__perlin_randtab
                                                   [stb__perlin_randtab[((int)lVar15 + 1) % x_wrap]
                                                    + uVar4]]] * 0x10;
  lVar10 = (ulong)"\a\t\x05"
                  [(ulong)stb__perlin_randtab
                          [(ulong)stb__perlin_randtab[stb__perlin_randtab[lVar15] + uVar4] + lVar7]
                   + lVar13] * 0x10;
  lVar3 = (ulong)"\a\t\x05"
                 [lVar13 + (ulong)stb__perlin_randtab
                                  [lVar7 + (ulong)stb__perlin_randtab
                                                  [stb__perlin_randtab[((int)lVar15 + 1) % x_wrap] +
                                                   uVar4]]] * 0x10;
  fVar23 = *(float *)(stb__perlin_grad_basis + lVar12 + 8) * fVar24 +
           *(float *)(stb__perlin_grad_basis + lVar12) * fVar29 +
           *(float *)(stb__perlin_grad_basis + lVar12 + 4) * fVar31;
  fVar24 = *(float *)(stb__perlin_grad_basis + lVar8 + 8) * fVar24 +
           *(float *)(stb__perlin_grad_basis + lVar8) * fVar21 +
           *(float *)(stb__perlin_grad_basis + lVar8 + 4) * fVar31;
  fVar27 = ((*(float *)(stb__perlin_grad_basis + lVar9 + 8) * fVar26 +
            *(float *)(stb__perlin_grad_basis + lVar9) * fVar29 +
            *(float *)(stb__perlin_grad_basis + lVar9 + 4) * fVar22) - fVar27) * fVar30 + fVar27;
  fVar28 = ((*(float *)(stb__perlin_grad_basis + lVar14 + 8) * fVar26 +
            *(float *)(stb__perlin_grad_basis + lVar14) * fVar21 +
            *(float *)(stb__perlin_grad_basis + lVar14 + 4) * fVar22) - fVar28) * fVar30 + fVar28;
  fVar28 = fVar25 * ((((*(float *)(stb__perlin_grad_basis + lVar10 + 8) * fVar26 +
                       *(float *)(stb__perlin_grad_basis + lVar10) * fVar21 +
                       *(float *)(stb__perlin_grad_basis + lVar10 + 4) * fVar31) - fVar24) * fVar30
                     + fVar24) - fVar28) + fVar28;
  return ((fVar25 * ((((*(float *)(stb__perlin_grad_basis + lVar3 + 8) * fVar26 +
                       *(float *)(stb__perlin_grad_basis + lVar3) * fVar29 +
                       *(float *)(stb__perlin_grad_basis + lVar3 + 4) * fVar31) - fVar23) * fVar30 +
                     fVar23) - fVar27) + fVar27) - fVar28) *
         ((fVar21 * 6.0 + -15.0) * fVar21 + 10.0) * fVar21 * fVar21 * fVar21 + fVar28;
}

Assistant:

float stb_perlin_noise3_wrap_nonpow2(float x, float y, float z, int x_wrap, int y_wrap, int z_wrap, unsigned char seed)
{
   float u,v,w;
   float n000,n001,n010,n011,n100,n101,n110,n111;
   float n00,n01,n10,n11;
   float n0,n1;

   int px = stb__perlin_fastfloor(x);
   int py = stb__perlin_fastfloor(y);
   int pz = stb__perlin_fastfloor(z);
   int x_wrap2 = (x_wrap ? x_wrap : 256);
   int y_wrap2 = (y_wrap ? y_wrap : 256);
   int z_wrap2 = (z_wrap ? z_wrap : 256);
   int x0 = px % x_wrap2, x1;
   int y0 = py % y_wrap2, y1;
   int z0 = pz % z_wrap2, z1;
   int r0,r1, r00,r01,r10,r11;

   if (x0 < 0) x0 += x_wrap2;
   if (y0 < 0) y0 += y_wrap2;
   if (z0 < 0) z0 += z_wrap2;
   x1 = (x0+1) % x_wrap2;
   y1 = (y0+1) % y_wrap2;
   z1 = (z0+1) % z_wrap2;

   #define stb__perlin_ease(a)   (((a*6-15)*a + 10) * a * a * a)

   x -= px; u = stb__perlin_ease(x);
   y -= py; v = stb__perlin_ease(y);
   z -= pz; w = stb__perlin_ease(z);

   r0 = stb__perlin_randtab[x0];
   r0 = stb__perlin_randtab[r0+seed];
   r1 = stb__perlin_randtab[x1];
   r1 = stb__perlin_randtab[r1+seed];

   r00 = stb__perlin_randtab[r0+y0];
   r01 = stb__perlin_randtab[r0+y1];
   r10 = stb__perlin_randtab[r1+y0];
   r11 = stb__perlin_randtab[r1+y1];

   n000 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r00+z0], x  , y  , z   );
   n001 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r00+z1], x  , y  , z-1 );
   n010 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r01+z0], x  , y-1, z   );
   n011 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r01+z1], x  , y-1, z-1 );
   n100 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r10+z0], x-1, y  , z   );
   n101 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r10+z1], x-1, y  , z-1 );
   n110 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r11+z0], x-1, y-1, z   );
   n111 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r11+z1], x-1, y-1, z-1 );

   n00 = stb__perlin_lerp(n000,n001,w);
   n01 = stb__perlin_lerp(n010,n011,w);
   n10 = stb__perlin_lerp(n100,n101,w);
   n11 = stb__perlin_lerp(n110,n111,w);

   n0 = stb__perlin_lerp(n00,n01,v);
   n1 = stb__perlin_lerp(n10,n11,v);

   return stb__perlin_lerp(n0,n1,u);
}